

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O3

word zzAddW2(word *a,size_t n,word w)

{
  ulong *puVar1;
  ulong uVar2;
  size_t sVar3;
  
  if (n != 0) {
    sVar3 = 0;
    do {
      puVar1 = a + sVar3;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + w;
      w = (word)CARRY8(uVar2,w);
      sVar3 = sVar3 + 1;
    } while (n != sVar3);
    return w;
  }
  return w;
}

Assistant:

word zzAddW2(word a[], size_t n, register word w)
{
	size_t i;
	ASSERT(wwIsValid(a, n));
#ifndef SAFE_FAST
	for (i = 0; i < n; ++i)
		a[i] += w, w = wordLess(a[i], w);
#else
	for (i = 0; w && i < n; ++i)
		a[i] += w, w = a[i] < w;
#endif
	return w;
}